

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

size_t write_float(MIR_context_t ctx,writer_func_t writer,float fl)

{
  size_t *psVar1;
  uint uVar2;
  reduce_data *data;
  int iVar3;
  uint8_t *puVar4;
  ulong uVar5;
  
  if (writer != (writer_func_t)0x0) {
    data = ctx->io_ctx->io_reduce_data;
    uVar2 = data->buf_bound;
    if ((ulong)uVar2 < 0x40000) {
      data->buf_bound = uVar2 + 1;
      puVar4 = data->buf + uVar2;
    }
    else {
      _reduce_encode_buf(data);
      data->buf_bound = 1;
      puVar4 = data->buf;
    }
    *puVar4 = '\x11';
    uVar5 = CONCAT44((int)((ulong)puVar4 >> 0x20),fl);
    iVar3 = 4;
    do {
      put_byte(ctx,writer,(uint)uVar5 & 0xff);
      uVar5 = uVar5 >> 8;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    psVar1 = &ctx->io_ctx->output_float_len;
    *psVar1 = *psVar1 + 5;
    return 5;
  }
  return 0;
}

Assistant:

static size_t write_float (MIR_context_t ctx, writer_func_t writer, float fl) {
  size_t len;

  if (writer == NULL) return 0;
  put_byte (ctx, writer, TAG_F);
  len = put_float (ctx, writer, fl) + 1;
  output_float_len += len;
  return len;
}